

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_digest.hpp
# Opt level: O3

void __thiscall duckdb_tdigest::TDigest::process(TDigest *this)

{
  pointer *ppCVar1;
  Centroid *pCVar2;
  long lVar3;
  ulong uVar4;
  pointer pCVar5;
  iterator iVar6;
  pointer pCVar7;
  pointer pCVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  Value VVar14;
  Weight WVar15;
  
  pCVar5 = (this->unprocessed_).
           super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pCVar8 = (this->unprocessed_).
           super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pCVar7 = pCVar5;
  if (pCVar5 != pCVar8) {
    uVar4 = (long)pCVar8 - (long)pCVar5 >> 4;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<duckdb_tdigest::Centroid*,std::vector<duckdb_tdigest::Centroid,std::allocator<duckdb_tdigest::Centroid>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb_tdigest::CentroidComparator>>
              (pCVar5,pCVar8,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<duckdb_tdigest::Centroid*,std::vector<duckdb_tdigest::Centroid,std::allocator<duckdb_tdigest::Centroid>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb_tdigest::CentroidComparator>>
              (pCVar5,pCVar8);
    pCVar5 = (this->unprocessed_).
             super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pCVar7 = (this->unprocessed_).
             super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  std::vector<duckdb_tdigest::Centroid,std::allocator<duckdb_tdigest::Centroid>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<duckdb_tdigest::Centroid_const*,std::vector<duckdb_tdigest::Centroid,std::allocator<duckdb_tdigest::Centroid>>>>
            ((vector<duckdb_tdigest::Centroid,std::allocator<duckdb_tdigest::Centroid>> *)
             &this->unprocessed_,pCVar5,
             (this->processed_).
             super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->processed_).
             super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  pCVar8 = (this->unprocessed_).
           super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::
  __inplace_merge<__gnu_cxx::__normal_iterator<duckdb_tdigest::Centroid*,std::vector<duckdb_tdigest::Centroid,std::allocator<duckdb_tdigest::Centroid>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb_tdigest::CentroidComparator>>
            (pCVar8,(long)pCVar5 + ((long)pCVar8 - (long)pCVar7),
             (this->unprocessed_).
             super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  this->processedWeight_ = this->unprocessedWeight_ + this->processedWeight_;
  this->unprocessedWeight_ = 0.0;
  pCVar2 = (this->processed_).
           super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar6._M_current =
       (this->processed_).
       super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar6._M_current != pCVar2) {
    (this->processed_).
    super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar2;
    iVar6._M_current = pCVar2;
  }
  pCVar2 = (this->unprocessed_).
           super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (iVar6._M_current ==
      (this->processed_).
      super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<duckdb_tdigest::Centroid,std::allocator<duckdb_tdigest::Centroid>>::
    _M_realloc_insert<duckdb_tdigest::Centroid_const&>
              ((vector<duckdb_tdigest::Centroid,std::allocator<duckdb_tdigest::Centroid>> *)
               &this->processed_,iVar6,pCVar2);
  }
  else {
    WVar15 = pCVar2->weight_;
    (iVar6._M_current)->mean_ = pCVar2->mean_;
    (iVar6._M_current)->weight_ = WVar15;
    ppCVar1 = &(this->processed_).
               super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppCVar1 = *ppCVar1 + 1;
  }
  WVar15 = ((this->unprocessed_).
            super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
            _M_impl.super__Vector_impl_data._M_start)->weight_;
  dVar11 = this->compression_;
  dVar10 = dVar11;
  if (1.0 <= dVar11) {
    dVar10 = 1.0;
  }
  dVar13 = this->processedWeight_;
  dVar11 = sin((dVar10 * 3.141592653589793) / dVar11 + -1.5707963267948966);
  pCVar5 = (this->unprocessed_).
           super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pCVar7 = (this->unprocessed_).
           super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pCVar8 = pCVar5 + 1;
  if (pCVar8 < pCVar7) {
    dVar13 = dVar13 * (dVar11 + 1.0) * 0.5;
    do {
      dVar11 = pCVar8->weight_;
      dVar10 = WVar15 + dVar11;
      if (dVar10 <= dVar13) {
        pCVar5 = (this->processed_).
                 super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        dVar12 = pCVar5[-1].weight_;
        if ((dVar12 != 0.0) || (NAN(dVar12))) {
          pCVar5[-1].weight_ = dVar11 + dVar12;
          VVar14 = ((pCVar8->mean_ - pCVar5[-1].mean_) * pCVar8->weight_) / (dVar11 + dVar12) +
                   pCVar5[-1].mean_;
        }
        else {
          pCVar5[-1].weight_ = dVar11;
          VVar14 = pCVar8->mean_;
        }
        pCVar5[-1].mean_ = VVar14;
      }
      else {
        dVar10 = WVar15 / this->processedWeight_;
        dVar11 = this->compression_;
        dVar12 = asin(dVar10 + dVar10 + -1.0);
        dVar10 = this->compression_;
        dVar13 = this->processedWeight_;
        dVar12 = ((dVar12 + 1.5707963267948966) * dVar11) / 3.141592653589793 + 1.0;
        dVar11 = dVar10;
        if (dVar12 <= dVar10) {
          dVar11 = dVar12;
        }
        dVar11 = sin((dVar11 * 3.141592653589793) / dVar10 + -1.5707963267948966);
        dVar10 = WVar15 + pCVar8->weight_;
        dVar13 = (dVar11 + 1.0) * 0.5 * dVar13;
        iVar6._M_current =
             (this->processed_).
             super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this->processed_).
            super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<duckdb_tdigest::Centroid,std::allocator<duckdb_tdigest::Centroid>>::
          _M_realloc_insert<duckdb_tdigest::Centroid_const&>
                    ((vector<duckdb_tdigest::Centroid,std::allocator<duckdb_tdigest::Centroid>> *)
                     &this->processed_,iVar6,pCVar8);
        }
        else {
          WVar15 = pCVar8->weight_;
          (iVar6._M_current)->mean_ = pCVar8->mean_;
          (iVar6._M_current)->weight_ = WVar15;
          ppCVar1 = &(this->processed_).
                     super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppCVar1 = *ppCVar1 + 1;
        }
      }
      pCVar8 = pCVar8 + 1;
      WVar15 = dVar10;
    } while (pCVar8 < pCVar7);
    pCVar5 = (this->unprocessed_).
             super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar7 = (this->unprocessed_).
             super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pCVar7 != pCVar5) {
    (this->unprocessed_).
    super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar5;
  }
  dVar11 = ((this->processed_).
            super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
            _M_impl.super__Vector_impl_data._M_start)->mean_;
  dVar10 = (this->processed_).
           super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
           _M_impl.super__Vector_impl_data._M_finish[-1].mean_;
  uVar4 = -(ulong)(dVar11 < this->min_);
  uVar9 = -(ulong)(this->max_ < dVar10);
  this->min_ = (Value)(~uVar4 & (ulong)this->min_ | (ulong)dVar11 & uVar4);
  this->max_ = (Value)(~uVar9 & (ulong)this->max_ | (ulong)dVar10 & uVar9);
  updateCumulative(this);
  return;
}

Assistant:

inline void process() {
		CentroidComparator cc;
		std::sort(unprocessed_.begin(), unprocessed_.end(), cc);
		auto count = unprocessed_.size();
		unprocessed_.insert(unprocessed_.end(), processed_.cbegin(), processed_.cend());
		std::inplace_merge(unprocessed_.begin(), unprocessed_.begin() + int64_t(count), unprocessed_.end(), cc);

		processedWeight_ += unprocessedWeight_;
		unprocessedWeight_ = 0;
		processed_.clear();

		processed_.push_back(unprocessed_[0]);
		Weight wSoFar = unprocessed_[0].weight();
		Weight wLimit = processedWeight_ * integratedQ(1.0);

		auto end = unprocessed_.end();
		for (auto iter = unprocessed_.cbegin() + 1; iter < end; iter++) {
			auto &centroid = *iter;
			Weight projectedW = wSoFar + centroid.weight();
			if (projectedW <= wLimit) {
				wSoFar = projectedW;
				(processed_.end() - 1)->add(centroid);
			} else {
				auto k1 = integratedLocation(wSoFar / processedWeight_);
				wLimit = processedWeight_ * integratedQ(k1 + 1.0);
				wSoFar += centroid.weight();
				processed_.emplace_back(centroid);
			}
		}
		unprocessed_.clear();
		min_ = std::min(min_, processed_[0].mean());
		max_ = std::max(max_, (processed_.cend() - 1)->mean());
		updateCumulative();
	}